

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

void utlru_cache_bench_test<1000000ul,12ul,100000ul,unsigned_long,unsigned_long,(cappuccino::thread_safe)1,(batch_insert)0>
               (seconds ttl)

{
  bool bVar1;
  ostream *poVar2;
  thread *worker;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  size_t i;
  type func;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  char *value_name;
  char *key_name;
  milliseconds local_100;
  utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> local_f8 [8];
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  cache;
  mutex cout_lock;
  seconds ttl_local;
  
  cout_lock.super___mutex_base._M_mutex._8_8_ = 0;
  cout_lock.super___mutex_base._M_mutex._16_8_ = 0;
  cache.m_lru_end._M_node = (_List_node_base *)0x0;
  cout_lock.super___mutex_base._M_mutex.__align = 0;
  cout_lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  cout_lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)ttl.__r;
  std::mutex::mutex((mutex *)&cache.m_lru_end);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_100,
             (duration<long,_std::ratio<1L,_1L>_> *)
             &cout_lock.super___mutex_base._M_mutex.__data.__list.__next);
  cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::utlru_cache
            (local_f8,local_100,100000,1.0);
  std::operator<<((ostream *)&std::cout,"ULRU ");
  std::operator<<((ostream *)&std::cout,"thread_safe::yes ");
  std::operator<<((ostream *)&std::cout,"Individual ");
  poVar2 = std::operator<<((ostream *)&std::cout,"<");
  poVar2 = std::operator<<(poVar2,"uint64");
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,"uint64");
  std::operator<<(poVar2,"> ");
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock,0xc);
  i = (size_t)local_f8;
  func.cache = (utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)&cache.m_lru_end;
  for (__range1 = (vector<std::thread,_std::allocator<std::thread>_> *)0x0;
      __range1 < (vector<std::thread,_std::allocator<std::thread>_> *)0xc;
      __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)
                 ((long)&(__range1->super__Vector_base<std::thread,_std::allocator<std::thread>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<utlru_cache_bench_test<1000000ul,12ul,100000ul,unsigned_long,unsigned_long,(cappuccino::thread_safe)1,(batch_insert)0>(std::chrono::duration<long,std::ratio<1l,1l>>)::_lambda()_1_&>
              ((vector<std::thread,std::allocator<std::thread>> *)&func.cout_lock,(type *)&i);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  worker = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&worker);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::~utlru_cache
            (local_f8);
  return;
}

Assistant:

static auto utlru_cache_bench_test(std::chrono::seconds ttl) -> void
{
    std::mutex                                          cout_lock{};
    utlru_cache<key_type, value_type, thread_safe_type> cache{ttl, cache_size};

    std::cout << "ULRU ";
    if constexpr (thread_safe_type == thread_safe::yes)
    {
        std::cout << "thread_safe::yes ";
    }
    else
    {
        std::cout << "thread_safe::no ";
    }

    auto key_name = "string";
    if constexpr (std::is_same<key_type, uint64_t>::value)
    {
        key_name = "uint64";
    }
    auto value_name = "string";
    if constexpr (std::is_same<value_type, uint64_t>::value)
    {
        value_name = "uint64";
    }

    if constexpr (batch_type == batch_insert::no)
    {
        std::cout << "Individual ";
    }
    else if constexpr (batch_type == batch_insert::yes)
    {
        std::cout << "Batch ";
    }
    std::cout << "<" << key_name << ", " << value_name << "> ";

    std::vector<std::thread> workers;
    workers.reserve(worker_count);

    auto func = [&]() mutable -> void
    {
        size_t worker_iterations = iterations / worker_count;

        std::chrono::milliseconds insert_elapsed{0};
        std::chrono::milliseconds find_elapsed{0};

        auto start = std::chrono::steady_clock::now();

        if constexpr (batch_type == batch_insert::no)
        {
            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, std::string>::value)
                {
                    auto s = to_string(i);
                    cache.insert(s, s);
                }
                else if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, uint64_t>::value)
                {
                    cache.insert(to_string(i), i);
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value && std::is_same<value_type, uint64_t>::value)
                {
                    cache.insert(i, i);
                }
                else if constexpr (
                    std::is_same<key_type, uint64_t>::value && std::is_same<value_type, std::string>::value)
                {
                    cache.insert(i, to_string(i));
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }
        }
        else
        {
            std::vector<std::pair<key_type, value_type>> data;
            data.reserve(worker_iterations);

            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, std::string>::value)
                {
                    auto s = to_string(i);
                    data.emplace_back(s, s);
                }
                else if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, uint64_t>::value)
                {
                    data.emplace_back(to_string(i), i);
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value && std::is_same<value_type, uint64_t>::value)
                {
                    data.emplace_back(i, i);
                }
                else if constexpr (
                    std::is_same<key_type, uint64_t>::value && std::is_same<value_type, std::string>::value)
                {
                    data.emplace_back(i, to_string(i));
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }

            cache.insert_range(std::move(data));
        }

        auto stop = std::chrono::steady_clock::now();

        insert_elapsed = std::chrono::duration_cast<std::chrono::milliseconds>(stop - start);

        start = std::chrono::steady_clock::now();

        if constexpr (batch_type == batch_insert::no)
        {
            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (std::is_same<key_type, std::string>::value)
                {
                    cache.find(to_string(i));
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value)
                {
                    cache.find(i);
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }
        }
        else
        {
            std::unordered_map<key_type, std::optional<value_type>> data;
            data.reserve(worker_iterations);

            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (std::is_same<key_type, std::string>::value)
                {
                    data.emplace(to_string(i), std::optional<value_type>{});
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value)
                {
                    data.emplace(i, std::optional<value_type>{});
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }

            cache.find_range_fill(data);
        }

        stop = std::chrono::steady_clock::now();

        find_elapsed = std::chrono::duration_cast<std::chrono::milliseconds>(stop - start);

        std::lock_guard guard{cout_lock};
        std::cout << "[" << insert_elapsed.count() << ", " << find_elapsed.count() << "] ";
    };

    for (size_t i = 0; i < worker_count; ++i)
    {
        workers.emplace_back(func);
    }

    for (auto& worker : workers)
    {
        worker.join();
    }

    std::cout << "\n";
}